

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_get_indexOutOfBounds_fn(int _i)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12ef05;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"01234567",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12ef43;
  cVar1 = AString_get(&string,8);
  if (cVar1 != '\0') {
    local_68 = (char *)(long)cVar1;
    ppcVar6 = &local_68;
    local_60 = "\'\\0\'";
    pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar8 = "AString_get(&string, 8) == \'\\0\'";
    pcVar10 = "AString_get(&string, 8)";
    iVar2 = 0x470;
    goto LAB_0012f6b2;
  }
  uStack_50 = 0x12ef5c;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x470);
  if (string.capacity == 0x10) {
    uStack_50 = 0x12ef7c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x471);
    if (string.buffer == (char *)0x0) {
      ppcVar6 = &local_58;
      pcVar4 = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar10 = "(void*) (string).buffer";
      iVar2 = 0x471;
      goto LAB_0012f6b2;
    }
    uStack_50 = 0x12ef99;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x471);
    pcVar3 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar3 = "(null)";
    }
    else {
      uStack_50 = 0x12efb9;
      iVar2 = strcmp("01234567",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x12efd2;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x471);
        if (string.size != 8) {
          iVar2 = 0x471;
          goto LAB_0012f65f;
        }
        uStack_50 = 0x12eff2;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x471);
        if (private_ACUtilsTest_AString_reallocCount != 0) {
          ppcVar6 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar10 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x472;
LAB_0012f6b2:
          uStack_50 = 0;
          local_58 = (char *)0x0;
          *(code **)((long)ppcVar6 + -8) = test_AString_get_nullptr_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,iVar2,pcVar4,pcVar3,pcVar8,pcVar10);
        }
        uStack_50 = 0x12f013;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x472);
        uStack_50 = 0x12f020;
        cVar1 = AString_get(&string,0xf);
        if (cVar1 != '\0') {
          local_68 = (char *)(long)cVar1;
          ppcVar6 = &local_68;
          local_60 = "\'\\0\'";
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "AString_get(&string, 15) == \'\\0\'";
          pcVar10 = "AString_get(&string, 15)";
          iVar2 = 0x473;
          goto LAB_0012f6b2;
        }
        uStack_50 = 0x12f039;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x473);
        if (string.capacity != 0x10) {
          iVar2 = 0x474;
          goto LAB_0012f58f;
        }
        uStack_50 = 0x12f059;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x474);
        if (string.buffer == (char *)0x0) {
          ppcVar6 = &local_58;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) (string).buffer != NULL";
          pcVar10 = "(void*) (string).buffer";
          iVar2 = 0x474;
          goto LAB_0012f6b2;
        }
        uStack_50 = 0x12f076;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x474);
        pcVar3 = string.buffer;
        if (string.buffer == (char *)0x0) {
          pcVar4 = "";
          pcVar3 = "(null)";
        }
        else {
          uStack_50 = 0x12f096;
          iVar2 = strcmp("01234567",string.buffer);
          if (iVar2 == 0) {
            uStack_50 = 0x12f0af;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x474);
            if (string.size == 8) {
              uStack_50 = 0x12f0cf;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x474);
              if (private_ACUtilsTest_AString_reallocCount != 0) {
                ppcVar6 = &local_68;
                local_60 = "(0)";
                local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
                pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
                pcVar10 = "private_ACUtilsTest_AString_reallocCount";
                iVar2 = 0x475;
                goto LAB_0012f6b2;
              }
              uStack_50 = 0x12f0f0;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x475);
              uStack_50 = 0x12f0fd;
              cVar1 = AString_get(&string,0x29a);
              if (cVar1 != '\0') {
                local_68 = (char *)(long)cVar1;
                ppcVar6 = &local_68;
                local_60 = "\'\\0\'";
                pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar8 = "AString_get(&string, 666) == \'\\0\'";
                pcVar10 = "AString_get(&string, 666)";
                iVar2 = 0x476;
                goto LAB_0012f6b2;
              }
              uStack_50 = 0x12f116;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x476);
              if (string.capacity != 0x10) {
                iVar2 = 0x477;
                goto LAB_0012f58f;
              }
              uStack_50 = 0x12f136;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x477);
              if (string.buffer == (char *)0x0) {
                ppcVar6 = &local_58;
                pcVar4 = "Assertion \'_ck_x != NULL\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                pcVar8 = "(void*) (string).buffer != NULL";
                pcVar10 = "(void*) (string).buffer";
                iVar2 = 0x477;
                goto LAB_0012f6b2;
              }
              uStack_50 = 0x12f153;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x477);
              pcVar3 = string.buffer;
              if (string.buffer == (char *)0x0) {
                pcVar3 = "(null)";
                pcVar4 = "";
              }
              else {
                uStack_50 = 0x12f170;
                iVar2 = strcmp("01234567",string.buffer);
                if (iVar2 == 0) {
                  uStack_50 = 0x12f189;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x477);
                  if (string.size == 8) {
                    uStack_50 = 0x12f1a9;
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x477);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      uStack_50 = 0x12f1ca;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x478);
                      uStack_50 = 0x12f1d3;
                      (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))
                                (string.buffer);
                      return;
                    }
                    ppcVar6 = &local_68;
                    local_60 = "(0)";
                    local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
                    pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar10 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x478;
                    goto LAB_0012f6b2;
                  }
                  iVar2 = 0x477;
                  goto LAB_0012f65f;
                }
                pcVar4 = "\"";
              }
              pcVar10 = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar7 = "(string).buffer == (\"01234567\")";
              pcVar9 = "(string).buffer";
              iVar2 = 0x477;
              local_58 = "\"";
              local_60 = "01234567";
              local_68 = "\"";
              pcStack_70 = "(\"01234567\")";
              ppcVar5 = &pcStack_80;
              pcStack_80 = pcVar3;
              pcStack_78 = pcVar4;
              goto LAB_0012f667;
            }
            iVar2 = 0x474;
LAB_0012f65f:
            local_60 = "strlen(\"01234567\")";
            pcVar9 = "(string).size";
            pcVar7 = "(string).size == strlen(\"01234567\")";
            local_58 = (char *)0x8;
            pcVar4 = (char *)string.size;
            goto LAB_0012f665;
          }
          pcVar4 = "\"";
        }
        pcVar10 = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar7 = "(string).buffer == (\"01234567\")";
        pcVar9 = "(string).buffer";
        iVar2 = 0x474;
        local_58 = "\"";
        local_60 = "01234567";
        local_68 = "\"";
        pcStack_70 = "(\"01234567\")";
        ppcVar5 = &pcStack_80;
        pcStack_80 = pcVar3;
        pcStack_78 = pcVar4;
        goto LAB_0012f667;
      }
      pcVar4 = "\"";
    }
    pcVar10 = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar7 = "(string).buffer == (\"01234567\")";
    pcVar9 = "(string).buffer";
    iVar2 = 0x471;
    local_58 = "\"";
    local_60 = "01234567";
    local_68 = "\"";
    pcStack_70 = "(\"01234567\")";
    ppcVar5 = &pcStack_80;
    pcStack_80 = pcVar3;
    pcStack_78 = pcVar4;
  }
  else {
    iVar2 = 0x471;
LAB_0012f58f:
    local_60 = "(16)";
    pcVar9 = "(string).capacity";
    pcVar7 = "(string).capacity == (16)";
    local_58 = (char *)0x10;
    pcVar4 = (char *)string.capacity;
LAB_0012f665:
    pcVar10 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
  }
LAB_0012f667:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x12f66e;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,pcVar10,pcVar8,pcVar7,pcVar9);
}

Assistant:

END_TEST
START_TEST(test_AString_get_indexOutOfBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234567", 16);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(AString_get(&string, 8), '\0');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_UINT_EQ(AString_get(&string, 15), '\0');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_UINT_EQ(AString_get(&string, 666), '\0');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}